

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O0

uint32_t helper_dcmpuq(CPUPPCState_conflict *env,ppc_fprp_t *a,ppc_fprp_t *b)

{
  undefined1 local_f8 [8];
  PPC_DFP dfp;
  ppc_fprp_t *b_local;
  ppc_fprp_t *a_local;
  CPUPPCState_conflict *env_local;
  
  dfp_prepare_decimal128((PPC_DFP *)local_f8,a,b,env);
  decNumberCompare((decNumber_conflict *)((long)&dfp.vb + 8),(decNumber_conflict *)(dfp.t.lsu + 9),
                   (decNumber_conflict *)(dfp.a.lsu + 9),(decContext *)(dfp.b.lsu + 9));
  dfp_finalize_decimal128((PPC_DFP *)local_f8);
  CMPU_PPs((PPC_DFP *)local_f8);
  return (uint32_t)(byte)dfp.context.status;
}

Assistant:

static void CMPO_PPs(struct PPC_DFP *dfp)
{
    dfp_set_CRBF_from_T(dfp);
    dfp_set_FPCC_from_CRBF(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXVC(dfp);
}